

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

void tt_done_blend(TT_Face face)

{
  GX_Blend P;
  FT_Memory memory;
  GX_HVVarTable pGVar1;
  GX_MVarTable P_00;
  ulong uVar2;
  long lVar3;
  
  P = face->blend;
  if (P != (GX_Blend)0x0) {
    memory = (face->root).memory;
    uVar2 = (ulong)P->mmvar->num_axis;
    ft_mem_free(memory,P->coords);
    P->coords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->normalizedcoords);
    P->normalizedcoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->normalized_stylecoords);
    P->normalized_stylecoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->mmvar);
    P->mmvar = (FT_MM_Var *)0x0;
    if (P->avar_segment != (GX_AVarSegment)0x0) {
      if (uVar2 != 0) {
        lVar3 = 0;
        do {
          ft_mem_free(memory,*(void **)((long)&P->avar_segment->correspondence + lVar3));
          *(undefined8 *)((long)&P->avar_segment->correspondence + lVar3) = 0;
          lVar3 = lVar3 + 0x10;
        } while (uVar2 << 4 != lVar3);
      }
      ft_mem_free(memory,P->avar_segment);
      P->avar_segment = (GX_AVarSegment)0x0;
    }
    if (P->hvar_table != (GX_HVVarTable)0x0) {
      ft_var_done_item_variation_store(face,&P->hvar_table->itemStore);
      ft_mem_free(memory,(P->hvar_table->widthMap).innerIndex);
      pGVar1 = P->hvar_table;
      (pGVar1->widthMap).innerIndex = (FT_UInt *)0x0;
      ft_mem_free(memory,(pGVar1->widthMap).outerIndex);
      pGVar1 = P->hvar_table;
      (pGVar1->widthMap).outerIndex = (FT_UInt *)0x0;
      ft_mem_free(memory,pGVar1);
      P->hvar_table = (GX_HVVarTable)0x0;
    }
    if (P->vvar_table != (GX_HVVarTable)0x0) {
      ft_var_done_item_variation_store(face,&P->vvar_table->itemStore);
      ft_mem_free(memory,(P->vvar_table->widthMap).innerIndex);
      pGVar1 = P->vvar_table;
      (pGVar1->widthMap).innerIndex = (FT_UInt *)0x0;
      ft_mem_free(memory,(pGVar1->widthMap).outerIndex);
      pGVar1 = P->vvar_table;
      (pGVar1->widthMap).outerIndex = (FT_UInt *)0x0;
      ft_mem_free(memory,pGVar1);
      P->vvar_table = (GX_HVVarTable)0x0;
    }
    if (P->mvar_table != (GX_MVarTable)0x0) {
      ft_var_done_item_variation_store(face,&P->mvar_table->itemStore);
      ft_mem_free(memory,P->mvar_table->values);
      P_00 = P->mvar_table;
      P_00->values = (GX_Value)0x0;
      ft_mem_free(memory,P_00);
      P->mvar_table = (GX_MVarTable)0x0;
    }
    ft_mem_free(memory,P->tuplecoords);
    P->tuplecoords = (FT_Fixed *)0x0;
    ft_mem_free(memory,P->glyphoffsets);
    P->glyphoffsets = (FT_ULong *)0x0;
    ft_mem_free(memory,P);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_done_blend( TT_Face  face )
  {
    FT_Memory  memory = FT_FACE_MEMORY( face );
    GX_Blend   blend  = face->blend;


    if ( blend )
    {
      FT_UInt  i, num_axes;


      /* blend->num_axis might not be set up yet */
      num_axes = blend->mmvar->num_axis;

      FT_FREE( blend->coords );
      FT_FREE( blend->normalizedcoords );
      FT_FREE( blend->normalized_stylecoords );
      FT_FREE( blend->mmvar );

      if ( blend->avar_segment )
      {
        for ( i = 0; i < num_axes; i++ )
          FT_FREE( blend->avar_segment[i].correspondence );
        FT_FREE( blend->avar_segment );
      }

      if ( blend->hvar_table )
      {
        ft_var_done_item_variation_store( face,
                                          &blend->hvar_table->itemStore );

        FT_FREE( blend->hvar_table->widthMap.innerIndex );
        FT_FREE( blend->hvar_table->widthMap.outerIndex );
        FT_FREE( blend->hvar_table );
      }

      if ( blend->vvar_table )
      {
        ft_var_done_item_variation_store( face,
                                          &blend->vvar_table->itemStore );

        FT_FREE( blend->vvar_table->widthMap.innerIndex );
        FT_FREE( blend->vvar_table->widthMap.outerIndex );
        FT_FREE( blend->vvar_table );
      }

      if ( blend->mvar_table )
      {
        ft_var_done_item_variation_store( face,
                                          &blend->mvar_table->itemStore );

        FT_FREE( blend->mvar_table->values );
        FT_FREE( blend->mvar_table );
      }

      FT_FREE( blend->tuplecoords );
      FT_FREE( blend->glyphoffsets );
      FT_FREE( blend );
    }
  }